

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *pNtk)

{
  char cVar1;
  Abc_Obj_t *pObj;
  int nDigits;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  char PrefLo [100];
  char PrefLi [100];
  
  uVar8 = 0;
  for (iVar7 = 0; iVar7 < pNtk->vPis->nSize; iVar7 = iVar7 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,iVar7);
    pcVar3 = Abc_ObjName(pAVar2);
    uVar5 = 0xffffffff;
    do {
      uVar5 = uVar5 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 == 'l');
    if ((int)uVar8 <= (int)uVar5) {
      uVar8 = uVar5;
    }
  }
  for (iVar7 = 0; iVar7 < pNtk->vPos->nSize; iVar7 = iVar7 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,iVar7);
    pcVar3 = Abc_ObjName(pAVar2);
    uVar5 = 0xffffffff;
    do {
      uVar5 = uVar5 + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 == 'l');
    if ((int)uVar8 <= (int)uVar5) {
      uVar8 = uVar5;
    }
  }
  if ((int)uVar8 < 0x62) {
    uVar4 = (ulong)uVar8;
    for (lVar6 = 0; uVar4 + 1 != lVar6; lVar6 = lVar6 + 1) {
      PrefLo[lVar6] = 'l';
      PrefLi[lVar6] = 'l';
    }
    PrefLi[uVar4 + 1] = 'i';
    PrefLo[uVar4 + 1] = 'o';
    iVar7 = 0;
    PrefLi[uVar4 + 2] = '\0';
    PrefLo[uVar4 + 2] = '\0';
    if (pNtk->ntkType != ABC_NTK_NETLIST) {
      nDigits = Abc_Base10Log(pNtk->nObjCounts[8]);
      for (; iVar7 < pNtk->vBoxes->nSize; iVar7 = iVar7 + 1) {
        pAVar2 = Abc_NtkBox(pNtk,iVar7);
        if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
          Abc_ObjNameDummy("l",iVar7,nDigits);
          Abc_ObjAssignName(pAVar2,Abc_ObjNameDummy::Buffer,(char *)0x0);
          pObj = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
          Abc_ObjNameDummy(PrefLi,iVar7,nDigits);
          Abc_ObjAssignName(pObj,Abc_ObjNameDummy::Buffer,(char *)0x0);
          pAVar2 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray];
          Abc_ObjNameDummy(PrefLo,iVar7,nDigits);
          Abc_ObjAssignName(pAVar2,Abc_ObjNameDummy::Buffer,(char *)0x0);
        }
      }
      return;
    }
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                  ,0x237,"void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *)");
  }
  __assert_fail("CountMax < 100-2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcNames.c"
                ,0x22f,"void Abc_NtkAddDummyBoxNames(Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkAddDummyBoxNames( Abc_Ntk_t * pNtk )
{
    char * pName, PrefLi[100], PrefLo[100];
    Abc_Obj_t * pObj;
    int nDigits, i, k, CountCur, CountMax = 0;
    // if PIs/POs already have nodes with what looks like latch names
    // we need to add different prefix for the new latches
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        CountCur = 0;
        pName = Abc_ObjName(pObj);
        for ( k = 0; pName[k]; k++ )
            if ( pName[k] == 'l' )
                CountCur++;
            else
                break;
        CountMax = Abc_MaxInt( CountMax, CountCur );
    }
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        CountCur = 0;
        pName = Abc_ObjName(pObj);
        for ( k = 0; pName[k]; k++ )
            if ( pName[k] == 'l' )
                CountCur++;
            else
                break;
        CountMax = Abc_MaxInt( CountMax, CountCur );
    }
//printf( "CountMax = %d\n", CountMax );
    assert( CountMax < 100-2 );
    for ( i = 0; i <= CountMax; i++ )
        PrefLi[i] = PrefLo[i] = 'l';
    PrefLi[i] = 'i';
    PrefLo[i] = 'o';
    PrefLi[i+1] = 0;
    PrefLo[i+1] = 0;
    // create latch names
    assert( !Abc_NtkIsNetlist(pNtk) );
    nDigits = Abc_Base10Log( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        Abc_ObjAssignName( pObj, Abc_ObjNameDummy("l", i, nDigits), NULL );
        Abc_ObjAssignName( Abc_ObjFanin0(pObj),  Abc_ObjNameDummy(PrefLi, i, nDigits), NULL );
        Abc_ObjAssignName( Abc_ObjFanout0(pObj), Abc_ObjNameDummy(PrefLo, i, nDigits), NULL );
    }
/*
    nDigits = Abc_Base10Log( Abc_NtkBlackboxNum(pNtk) );
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
    {
        pName = Abc_ObjAssignName( pObj, Abc_ObjNameDummy("B", i, nDigits), NULL );
        nDigitsF = Abc_Base10Log( Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), pName, Abc_ObjNameDummy("i", k, nDigitsF) );
        nDigitsF = Abc_Base10Log( Abc_ObjFanoutNum(pObj) );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Abc_ObjAssignName( Abc_ObjFanin0(pObj), pName, Abc_ObjNameDummy("o", k, nDigitsF) );
    }
*/
}